

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithOneError::runTestCase(TestCharReaderTestparseWithOneError *this)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  CharReader *file;
  char *in_RDI;
  bool ok;
  char doc [26];
  Value root;
  string errs;
  CharReader *reader;
  CharReaderBuilder b;
  char *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  CharReaderBuilder *this_00;
  uint line;
  undefined7 in_stack_ffffffffffffff40;
  char local_b8 [8];
  undefined2 in_stack_ffffffffffffff50;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffff52;
  undefined2 uVar6;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar7;
  char acStack_a6 [14];
  undefined1 local_98 [40];
  string local_70 [48];
  CharReader *local_40;
  CharReaderBuilder local_38;
  
  this_00 = &local_38;
  Json::CharReaderBuilder::CharReaderBuilder(this_00);
  file = Json::CharReaderBuilder::newCharReader
                   ((CharReaderBuilder *)
                    CONCAT44(in_stack_ffffffffffffff54,
                             CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)));
  local_40 = file;
  std::__cxx11::string::string(local_70);
  Json::Value::Value((Value *)this_00,(ValueType)((ulong)in_RDI >> 0x20));
  line = (uint)((ulong)this_00 >> 0x20);
  builtin_strncpy(acStack_a6,"alue\" }",8);
  builtin_strncpy(local_b8,"{ \"prope",8);
  uVar5 = 0x7472;
  uVar6 = 0x2279;
  uVar7._0_1_ = ' ';
  uVar7._1_1_ = ':';
  uVar7._2_1_ = ':';
  uVar7._3_1_ = ' ';
  uVar4 = (*local_40->_vptr_CharReader[2])(local_40,local_b8,acStack_a6 + 7,local_98,local_70);
  bVar1 = (byte)uVar4;
  bVar2 = bVar1 & 1;
  if ((uVar4 & 1) != 0) {
    JsonTest::TestResult::addFailure
              ((TestResult *)(CONCAT17(bVar1,in_stack_ffffffffffffff40) & 0x1ffffffffffffff),
               (char *)file,line,in_RDI);
  }
  uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff26,
                                                  in_stack_ffffffffffffff20)),
                          in_stack_ffffffffffffff18);
  if (!(bool)uVar3) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(bVar2,in_stack_ffffffffffffff40),(char *)file,line,in_RDI);
  }
  if (local_40 != (CharReader *)0x0) {
    (*local_40->_vptr_CharReader[1])();
  }
  Json::Value::~Value((Value *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  std::__cxx11::string::~string(local_70);
  Json::CharReaderBuilder::~CharReaderBuilder
            ((CharReaderBuilder *)CONCAT17(bVar1,CONCAT16(uVar3,in_stack_ffffffffffffff20)));
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"property\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 15\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}